

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam_mono.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ostream *poVar2;
  long lVar3;
  int local_67c;
  vector<int,_std::allocator<int>_> local_678;
  _InputArray local_660;
  allocator<char> local_641;
  string local_640 [39];
  char local_619;
  undefined1 local_618 [7];
  char key;
  allocator<char> local_5f9;
  string local_5f8 [32];
  _InputArray local_5d8;
  Size_<int> local_5c0;
  _OutputArray local_5b8;
  _InputArray local_5a0;
  Mat local_588 [8];
  Mat small_img;
  Scalar_<double> local_528;
  _InputArray local_508;
  _InputArray local_4f0;
  _OutputArray local_4d8;
  _InputArray local_4c0;
  Mat local_4a8 [8];
  Mat rect_imgr;
  Mat local_448 [8];
  Mat rect_imgl;
  Mat local_3e8 [8];
  Mat raw_imgr;
  Mat local_388 [8];
  Mat raw_imgl;
  allocator<char> local_321;
  string local_320 [39];
  allocator<char> local_2f9;
  string local_2f8 [39];
  allocator<char> local_2d1;
  string local_2d0 [39];
  allocator<char> local_2a9;
  string local_2a8 [8];
  string param_win_name;
  char win_name [256];
  VideoCapture local_128 [8];
  VideoCapture vcapture;
  Mat local_f8 [8];
  Mat raw_img;
  string local_98;
  allocator<char> local_71;
  string local_70 [8];
  string image_name;
  allocator<char> local_39;
  string local_38 [8];
  string param_name;
  char **argv_local;
  int argc_local;
  
  param_name.field_2._8_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"../astar_calicam_mono.yml",&local_39)
  ;
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"../times_square.jpg",&local_71);
  std::allocator<char>::~allocator(&local_71);
  if (argc == 2) {
    std::__cxx11::string::operator=(local_38,*(char **)(param_name.field_2._8_8_ + 8));
  }
  else if (argc == 3) {
    std::__cxx11::string::operator=(local_38,*(char **)(param_name.field_2._8_8_ + 8));
    std::__cxx11::string::operator=(local_70,*(char **)(param_name.field_2._8_8_ + 0x10));
  }
  std::__cxx11::string::string((string *)&local_98,local_38);
  LoadParameters(&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  InitRectifyMap();
  cv::Mat::Mat(local_f8);
  cv::VideoCapture::VideoCapture(local_128);
  if ((live & 1U) == 0) {
    cv::imread((string *)(win_name + 0xf8),(int)local_70);
    cv::Mat::operator=(local_f8,(Mat *)(win_name + 0xf8));
    cv::Mat::~Mat((Mat *)(win_name + 0xf8));
  }
  else {
    cv::VideoCapture::open((int)local_128,0);
    bVar1 = cv::VideoCapture::isOpened();
    if ((bVar1 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Camera doesn\'t work");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
    cv::VideoCapture::set((int)local_128,(double)cap_cols);
    cv::VideoCapture::set((int)local_128,(double)cap_rows);
    cv::VideoCapture::set((int)local_128,30.0);
  }
  sprintf(param_win_name.field_2._M_local_buf + 8,"Raw Image: %d x %d",(ulong)(uint)cap_cols,
          (ulong)(uint)cap_rows);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a8,param_win_name.field_2._M_local_buf + 8,&local_2a9);
  std::allocator<char>::~allocator(&local_2a9);
  cv::namedWindow(local_2a8,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"V. FoV:  60    +",&local_2d1);
  cv::createTrackbar(local_2d0,local_2a8,(int *)0x0,vfov_max,OnTrackAngle,(void *)0x0);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"V. FoV:  60    +",&local_2f9);
  cv::setTrackbarPos(local_2f8,local_2a8,vfov_bar);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_320,"Size:  480 +",&local_321);
  cv::createTrackbar(local_320,local_2a8,(int *)0x0,size_max,OnTrackSize,(void *)0x0);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator(&local_321);
  cv::Mat::Mat(local_388);
  cv::Mat::Mat(local_3e8);
  cv::Mat::Mat(local_448);
  cv::Mat::Mat(local_4a8);
  do {
    if ((changed & 1U) != 0) {
      InitRectifyMap();
      changed = false;
    }
    if ((live & 1U) != 0) {
      cv::VideoCapture::operator>>(local_128,local_f8);
    }
    lVar3 = cv::Mat::total();
    if (lVar3 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Image capture error");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
    cv::Mat::operator=(local_388,local_f8);
    cv::_InputArray::_InputArray(&local_4c0,local_f8);
    cv::_OutputArray::_OutputArray(&local_4d8,local_448);
    cv::_InputArray::_InputArray(&local_4f0,(Mat *)fmap);
    cv::_InputArray::_InputArray(&local_508,(Mat *)(fmap + 0x60));
    cv::Scalar_<double>::Scalar_(&local_528);
    cv::remap(&local_4c0,&local_4d8,&local_4f0,&local_508,1,0,(Scalar_ *)&local_528);
    cv::_InputArray::~_InputArray(&local_508);
    cv::_InputArray::~_InputArray(&local_4f0);
    cv::_OutputArray::~_OutputArray(&local_4d8);
    cv::_InputArray::~_InputArray(&local_4c0);
    cv::Mat::Mat(local_588);
    cv::_InputArray::_InputArray(&local_5a0,local_388);
    cv::_OutputArray::_OutputArray(&local_5b8,local_588);
    cv::Size_<int>::Size_(&local_5c0);
    cv::resize(0,&local_5a0,&local_5b8,&local_5c0,1);
    cv::_OutputArray::~_OutputArray(&local_5b8);
    cv::_InputArray::~_InputArray(&local_5a0);
    cv::_InputArray::_InputArray(&local_5d8,local_588);
    cv::imshow(local_2a8,&local_5d8);
    cv::_InputArray::~_InputArray(&local_5d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_5f8,"Rectified Image",&local_5f9);
    cv::_InputArray::_InputArray((_InputArray *)local_618,local_448);
    cv::imshow(local_5f8,(_InputArray *)local_618);
    cv::_InputArray::~_InputArray((_InputArray *)local_618);
    std::__cxx11::string::~string(local_5f8);
    std::allocator<char>::~allocator(&local_5f9);
    local_619 = cv::waitKey(1);
    if (local_619 == '1') {
      mode = RECT_PERSPECTIVE;
      changed = true;
    }
    if (local_619 == '2') {
      mode = RECT_CYLINDRICAL;
      changed = true;
    }
    if (local_619 == '3') {
      mode = RECT_FISHEYE;
      changed = true;
    }
    if (local_619 == '4') {
      mode = RECT_LONGLAT;
      changed = true;
    }
    if (local_619 == ' ') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_640,"img.jpg",&local_641);
      cv::_InputArray::_InputArray(&local_660,local_448);
      local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::vector(&local_678);
      cv::imwrite(local_640,&local_660,(vector *)&local_678);
      std::vector<int,_std::allocator<int>_>::~vector(&local_678);
      cv::_InputArray::~_InputArray(&local_660);
      std::__cxx11::string::~string(local_640);
      std::allocator<char>::~allocator(&local_641);
    }
    if (((local_619 == 'q') || (local_619 == 'Q')) || (local_619 == '\x1b')) {
      local_67c = 3;
    }
    else {
      local_67c = 0;
    }
    cv::Mat::~Mat(local_588);
  } while (local_67c == 0);
  cv::Mat::~Mat(local_4a8);
  cv::Mat::~Mat(local_448);
  cv::Mat::~Mat(local_3e8);
  cv::Mat::~Mat(local_388);
  std::__cxx11::string::~string(local_2a8);
  cv::VideoCapture::~VideoCapture(local_128);
  cv::Mat::~Mat(local_f8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  std::string param_name = "../astar_calicam_mono.yml";
  std::string image_name = "../times_square.jpg";

  if (argc == 2) {
    param_name = argv[1];
  } else if (argc == 3) {
    param_name = argv[1];
    image_name = argv[2];
  }

  LoadParameters(param_name);
  InitRectifyMap();

  cv::Mat raw_img;
  cv::VideoCapture vcapture;
  if (live) {
    vcapture.open(0);

    if (!vcapture.isOpened()) {
      std::cout << "Camera doesn't work" << std::endl;
      exit(-1);
    }

    vcapture.set(cv::CAP_PROP_FRAME_WIDTH,  cap_cols);
    vcapture.set(cv::CAP_PROP_FRAME_HEIGHT, cap_rows);
    vcapture.set(cv::CAP_PROP_FPS, 30);
  } else {
    raw_img = cv::imread(image_name, cv::IMREAD_COLOR);
  }

  char win_name[256];
  sprintf(win_name, "Raw Image: %d x %d", cap_cols, cap_rows);
  std::string param_win_name(win_name);
  cv::namedWindow(param_win_name);

  cv::createTrackbar("V. FoV:  60    +", param_win_name, nullptr,   vfov_max,   OnTrackAngle);
  cv::setTrackbarPos("V. FoV:  60    +", param_win_name, vfov_bar);
  cv::createTrackbar("Size:  480 +", param_win_name, nullptr,  size_max,  OnTrackSize);

  cv::Mat raw_imgl, raw_imgr, rect_imgl, rect_imgr;
  while (1) {
    if (changed) {
      InitRectifyMap();
      changed = false;
    }

    if (live)
      vcapture >> raw_img;

    if (raw_img.total() == 0) {
      std::cout << "Image capture error" << std::endl;
      exit(-1);
    }

    raw_imgl = raw_img;
    cv::remap(raw_img, rect_imgl, fmap[0], fmap[1], 1, 0);

    cv::Mat small_img;
    cv::resize(raw_imgl, small_img, cv::Size(), 0.5, 0.5);
    imshow(param_win_name, small_img);
    imshow("Rectified Image", rect_imgl);

    char key = cv::waitKey(1);

    if (key == '1') {
      mode = RECT_PERSPECTIVE;
      changed = true;
    }

    if (key == '2') {
      mode = RECT_CYLINDRICAL;
      changed = true;
    }

    if (key == '3') {
      mode = RECT_FISHEYE;
      changed = true;
    }

    if (key == '4') {
      mode = RECT_LONGLAT;
      changed = true;
    }

    if (key == 32) {
      imwrite("img.jpg", rect_imgl);
    }

    if (key == 'q' || key == 'Q' || key == 27)
      break;
  }

  return 0;
}